

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<int,_ft::allocator<int>_>::insert
          (list<int,_ft::allocator<int>_> *this,iterator *position,size_type n,
          value_type_conflict *val)

{
  listIterator<int> local_50;
  undefined1 local_40 [24];
  size_type i;
  value_type_conflict *val_local;
  size_type n_local;
  iterator *position_local;
  list<int,_ft::allocator<int>_> *this_local;
  
  i = (size_type)val;
  val_local = (value_type_conflict *)n;
  n_local = (size_type)position;
  position_local = (iterator *)this;
  for (local_40._16_8_ = (value_type_conflict *)0x0; (ulong)local_40._16_8_ < val_local;
      local_40._16_8_ = local_40._16_8_ + 1) {
    listIterator<int>::listIterator(&local_50,position);
    insert((list<int,_ft::allocator<int>_> *)local_40,(iterator *)this,
           (value_type_conflict *)&local_50);
    listIterator<int>::~listIterator((listIterator<int> *)local_40);
    listIterator<int>::~listIterator(&local_50);
  }
  return;
}

Assistant:

void 		insert(iterator position, size_type n, value_type const & val) {
		for (size_type i = 0; i < n; ++i)
			this->insert(position, val);
	}